

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionStamp.hpp
# Opt level: O0

void __thiscall
OpenMD::TorsionStamp::setMembers(TorsionStamp *this,tuple<int,_int,_int,_int> *tuple)

{
  vector<int,_std::allocator<int>_> *this_00;
  __tuple_element_t<2UL,_tuple<int,_int,_int,_int>_> *__x;
  type_conflict1 *fourth;
  type_conflict1 *third;
  type_conflict1 *second;
  type_conflict1 *first;
  
  std::get<0ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2cb737);
  this_00 = (vector<int,_std::allocator<int>_> *)
            std::get<1ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2cb746);
  __x = std::get<2ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2cb755);
  std::get<3ul,int,int,int,int>((tuple<int,_int,_int,_int> *)0x2cb764);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  std::vector<int,_std::allocator<int>_>::push_back(this_00,__x);
  return;
}

Assistant:

void setMembers(const std::tuple<int, int, int, int>& tuple) {
      auto [first, second, third, fourth] = tuple;

      members_.push_back(first);
      members_.push_back(second);
      members_.push_back(third);
      members_.push_back(fourth);
    }